

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *os;
  Colour colourGuard;
  SourceLineInfo local_20;
  
  Colour::use(FileName);
  os = this->stream;
  local_20.file = (this->result->m_info).lineInfo.file;
  local_20.line = (this->result->m_info).lineInfo.line;
  operator<<(os,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(os,": ",2);
  Colour::use(None);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }